

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *pcVar3;
  ostream *poVar4;
  float fVar5;
  vec_3d vVar6;
  euler eVar7;
  quaternion qVar8;
  quaternion q4;
  quaternion q3;
  quaternion q2;
  quaternion q1;
  quaternion test_quat;
  euler eul;
  quaternion quat;
  float d;
  vec_3d c;
  vec_3d b;
  vec_3d a;
  quaternion *in_quat2;
  vec_3d *in_stack_fffffffffffffee0;
  quaternion *in_quat;
  float local_f4;
  float local_f0;
  float local_ec;
  anon_union_4_2_0ec104fb_for_quaternion__0 local_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  anon_union_4_2_5f91f90e_for_euler__4 local_90;
  undefined8 local_88;
  anon_union_4_2_5f91f90e_for_euler__4 local_80;
  undefined8 local_78;
  anon_union_4_2_5f91f90e_for_euler__4 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  float local_34;
  undefined8 local_30;
  float local_28;
  quaternion local_20;
  quaternion local_10;
  
  local_10.field_1.dual.z = 0.0;
  local_10._0_8_ = 0x400000003f800000;
  local_10.field_1.dual.y = 3.0;
  local_20._0_8_ = 0x3f8000003f800000;
  local_20.field_1.dual.y = 1.0;
  local_28 = 0.0;
  local_30 = 0;
  local_34 = 0.0;
  in_quat2 = &local_10;
  pcVar3 = print_vector(in_stack_fffffffffffffee0,(char *)in_quat2);
  std::operator<<((ostream *)&std::cout,pcVar3);
  in_quat = &local_20;
  pcVar3 = print_vector((vec_3d *)in_quat,(char *)in_quat2);
  std::operator<<((ostream *)&std::cout,pcVar3);
  local_34 = operator~((vec_3d *)in_quat);
  poVar4 = std::operator<<((ostream *)&std::cout,"|a| =");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_34);
  std::operator<<(poVar4,"\n");
  local_34 = operator~((vec_3d *)in_quat);
  poVar4 = std::operator<<((ostream *)&std::cout,"|b| =");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_34);
  std::operator<<(poVar4,"\n");
  local_34 = operator*((vec_3d *)in_quat2,(vec_3d *)in_quat);
  poVar4 = std::operator<<((ostream *)&std::cout,"Dot product: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_34);
  std::operator<<(poVar4,"\n");
  vVar6 = operator^((vec_3d *)in_quat2,(vec_3d *)in_quat);
  local_48 = vVar6.z;
  local_50 = vVar6._0_8_;
  local_40 = local_50;
  local_38 = local_48;
  local_30 = local_50;
  local_28 = local_48;
  std::operator<<((ostream *)&std::cout,"Vector product ");
  pcVar3 = print_vector((vec_3d *)in_quat,(char *)in_quat2);
  std::operator<<((ostream *)&std::cout,pcVar3);
  local_68 = 0x3f3504813f350481;
  uStack_60 = 0;
  local_70 = (anon_union_4_2_5f91f90e_for_euler__4)0x0;
  local_78 = 0;
  eVar7 = euler_from_quat(in_quat);
  local_90 = eVar7.field_2;
  local_98 = eVar7._0_8_;
  local_88 = local_98;
  local_80 = local_90;
  local_78 = local_98;
  local_70 = local_90;
  poVar4 = std::operator<<((ostream *)&std::cout,"Euler: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78._4_4_);
  pcVar3 = ", ";
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_78);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_70.yaw);
  std::operator<<(poVar4,"\n");
  qVar8 = quat_from_euler((euler *)pcVar3);
  uStack_b0 = qVar8.field_1._4_8_;
  local_b8 = qVar8._0_8_;
  local_a8 = local_b8;
  uStack_a0 = uStack_b0;
  poVar4 = std::operator<<((ostream *)&std::cout,"Quaternion: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_a8);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_a8._4_4_);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)uStack_a0);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uStack_a0._4_4_);
  std::operator<<(poVar4,"\n");
  local_c8 = (undefined1  [8])0xbf8000003f800000;
  uStack_c0 = 0x3f800000bf800000;
  local_d8 = (undefined1  [8])0xbf800000bf800000;
  uStack_d0 = 0xbf800000bf800000;
  qVar8 = quaternion_multiply(in_quat,in_quat2);
  poVar4 = std::operator<<((ostream *)&std::cout,"Quaternion: ");
  local_e8 = qVar8.field_0;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_e8.w);
  poVar4 = std::operator<<(poVar4,", ");
  fStack_e4 = qVar8.field_1._0_4_;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fStack_e4);
  poVar4 = std::operator<<(poVar4,", ");
  local_e0 = qVar8.field_1._4_4_;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_e0);
  poVar4 = std::operator<<(poVar4,", ");
  fStack_dc = qVar8.field_1._8_4_;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fStack_dc);
  std::operator<<(poVar4,"\n");
  uVar2 = local_c8._0_4_;
  uVar1 = local_d8._0_4_;
  fVar5 = operator*((vec_3d *)(local_c8 + 4),(vec_3d *)(local_d8 + 4));
  poVar4 = std::operator<<((ostream *)&std::cout,"Quaternion: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)uVar2 * (float)uVar1 + -fVar5);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_f4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_f0);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_ec);
  std::operator<<(poVar4,"\n");
  return 0;
}

Assistant:

auto main() -> int {
    vec_3d a = {1.f, 2.f, 3.f};
    vec_3d b = {1.f, 1.f, 1.f};
    vec_3d c = {0.f};
    float d = 0.f;

    std::cout << print_vector(&a, "a");
    std::cout << print_vector(&b, "b");

    d = ~a;
    std::cout << "|a| =" << d << "\n";
    d = ~b;
    std::cout << "|b| =" << d << "\n";

    d = a * b;
    std::cout << "Dot product: " << d << "\n";

    c = a ^ b;
    std::cout << "Vector product ";
    std::cout << print_vector(&c, "c");

    quaternion quat = {0.7071f, 0.7071f, 0.f, 0.f};
    euler eul = {0.f};
    eul = euler_from_quat(&quat);
    std::cout << "Euler: " << eul.pitch << ", " << eul.roll << ", " << eul.yaw
              << "\n";

    quaternion test_quat;
    test_quat = quat_from_euler(&eul);
    std::cout << "Quaternion: " << test_quat.w << ", " << test_quat.dual.x
              << ", " << test_quat.dual.y << ", " << test_quat.dual.z << "\n";

    assert(fabsf(test_quat.q0 - quat.q0) < 0.1f);
    assert(fabsf(test_quat.q1 - quat.q1) < 0.1f);
    assert(fabsf(test_quat.q2 - quat.q2) < 0.1f);
    assert(fabsf(test_quat.q3 - quat.q3) < 0.1f);

    quaternion q1 = {1.f, -1.f, -1.f, 1.f};
    quaternion q2 = {-1.f, -1.f, -1.f, -1.f};
    quaternion q3 = quaternion_multiply(&q1, &q2);
    std::cout << "Quaternion: " << q3.q0 << ", " << q3.q1 << ", " << q3.q2
              << ", " << q3.q3 << "\n";

    quaternion q4;
    q4.w = q1.q0 * q2.q0 - (q1.dual * q2.dual);

    std::cout << "Quaternion: " << q4.q0 << ", " << q4.q1 << ", " << q4.q2
              << ", " << q4.q3 << "\n";

    return 0;
}